

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

llbuild_rlim_t llbuild::basic::sys::getOpenFileLimit(void)

{
  int iVar1;
  undefined1 auStack_20 [4];
  int ret;
  rlimit rl;
  
  iVar1 = getrlimit(RLIMIT_NOFILE,(rlimit *)auStack_20);
  if (iVar1 == 0) {
    rl.rlim_max = _auStack_20;
  }
  else {
    rl.rlim_max = 0;
  }
  return rl.rlim_max;
}

Assistant:

llbuild_rlim_t sys::getOpenFileLimit() {
#if defined(_WIN32)
  return _getmaxstdio();
#else
  struct rlimit rl;
  int ret = getrlimit(RLIMIT_NOFILE, &rl);
  if (ret != 0) {
    return 0;
  }

  return rl.rlim_cur;
#endif
}